

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_request.hpp
# Opt level: O0

void __thiscall cinatra::coro_http_request::set_body(coro_http_request *this,string *body)

{
  content_type cVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  __sv_type _Var2;
  content_type type;
  http_parser *in_stack_000000d0;
  undefined1 in_stack_000000d8 [16];
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  pointer local_20;
  char *local_18;
  
  _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view(in_RDI);
  local_20 = (pointer)_Var2._M_len;
  in_RDI[3]._M_dataplus._M_p = local_20;
  local_18 = _Var2._M_str;
  in_RDI[3]._M_string_length = (size_type)local_18;
  cVar1 = get_content_type((coro_http_request *)
                           CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  if (cVar1 == urlencoded) {
    http_parser::parse_query(in_stack_000000d0,(string_view)in_stack_000000d8);
  }
  return;
}

Assistant:

void set_body(std::string &body) {
    body_ = body;
    auto type = get_content_type();
    if (type == content_type::urlencoded) {
      parser_.parse_query(body_);
    }
  }